

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

bool pstore::index::details::internal_node::validate_after_load
               (internal_node *internal,typed_address<pstore::index::details::internal_node> addr)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  internal_node *internal_local;
  typed_address<pstore::index::details::internal_node> addr_local;
  
  bVar1 = std::operator!=(&internal->signature_,(array<unsigned_char,_8UL> *)&node_signature_);
  if (bVar1) {
    addr_local.a_.a_._7_1_ = false;
  }
  else {
    __first = std::begin<pstore::index::details::internal_node>(internal);
    __last = std::end<pstore::index::details::internal_node>(internal);
    addr_local.a_.a_._7_1_ =
         std::
         all_of<pstore::index::details::index_pointer_const*,pstore::index::details::internal_node::validate_after_load(pstore::index::details::internal_node_const&,pstore::typed_address<pstore::index::details::internal_node>)::__0>
                   (__first,__last,(anon_class_8_1_898948ef)addr.a_.a_);
  }
  return addr_local.a_.a_._7_1_;
}

Assistant:

bool internal_node::validate_after_load (internal_node const & internal,
                                                     typed_address<internal_node> const addr) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (internal.signature_ != node_signature_) {
                    return false;
                }
#endif
                return std::all_of (std::begin (internal), std::end (internal),
                                    [addr] (index_pointer const & child) {
                                        if (child.is_heap () ||
                                            child.untag_address<internal_node> () >= addr) {
                                            return false;
                                        }
                                        return true;
                                    });
            }